

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

qpdf_data qpdfjob_create_qpdf(qpdfjob_handle j)

{
  bool bVar1;
  _qpdf_data *local_98;
  exception *e;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf;
  qpdfjob_handle j_local;
  
  qpdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                 (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)j;
  QUtil::setLineBuf(_stdout);
  QPDFJob::createQPDF((QPDFJob *)&stack0xffffffffffffffe0);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_98 = (_qpdf_data *)operator_new(0x148);
    _qpdf_data::_qpdf_data
              (local_98,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&stack0xffffffffffffffe0);
  }
  else {
    local_98 = (_qpdf_data *)0x0;
  }
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&stack0xffffffffffffffe0);
  return local_98;
}

Assistant:

qpdf_data
qpdfjob_create_qpdf(qpdfjob_handle j)
{
    QUtil::setLineBuf(stdout);
    try {
        auto qpdf = j->j.createQPDF();
        return qpdf ? new _qpdf_data(std::move(qpdf)) : nullptr;
    } catch (std::exception& e) {
        *j->j.getLogger()->getError() << j->j.getMessagePrefix() << ": " << e.what() << "\n";
    }
    return nullptr;
}